

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vacuum_statement.cpp
# Opt level: O1

void __thiscall
duckdb::VacuumStatement::VacuumStatement(VacuumStatement *this,VacuumOptions *options)

{
  _Head_base<0UL,_duckdb::VacuumInfo_*,_false> this_00;
  
  (this->super_SQLStatement).type = VACUUM_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__VacuumStatement_0247e808;
  this_00._M_head_impl = (VacuumInfo *)operator_new(0x38);
  VacuumInfo::VacuumInfo(this_00._M_head_impl,*options);
  (this->info).super_unique_ptr<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::VacuumInfo,_std::default_delete<duckdb::VacuumInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::VacuumInfo_*,_std::default_delete<duckdb::VacuumInfo>_>.
  super__Head_base<0UL,_duckdb::VacuumInfo_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

VacuumStatement::VacuumStatement(const VacuumOptions &options)
    : SQLStatement(StatementType::VACUUM_STATEMENT), info(make_uniq<VacuumInfo>(options)) {
}